

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::QueryGeometrySeparate::draw
          (QueryGeometrySeparate *this,GLuint primitive_case)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  GLuint primitive_case_local;
  QueryGeometrySeparate *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext
                     (*(Context **)
                       (&(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                         field_0x78 +
                       (long)(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                             _vptr_CaptureGeometryInterleaved[-3]));
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x20))
            (0x8c88,*(undefined4 *)
                     &(this->super_CaptureGeometrySeparate).super_CaptureGeometryInterleaved.
                      field_0x14);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBeginQuery call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xffb);
  CaptureGeometrySeparate::draw(&this->super_CaptureGeometrySeparate,primitive_case);
  (**(code **)(lVar4 + 0x628))(0x8c88);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEndQuery call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1000);
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryGeometrySeparate::draw(glw::GLuint primitive_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginQuery call failed.");

	gl3cts::TransformFeedback::CaptureGeometrySeparate::draw(primitive_case);

	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndQuery call failed.");
}